

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O1

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::builder_swap_after_finish_test(bool run)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint val;
  uint val_00;
  bool bVar2;
  Offset<MyGame::Example::Monster> OVar3;
  undefined7 in_register_00000039;
  TestHeapBuilder src;
  TestHeapBuilder dst;
  string local_138;
  FlatBufferBuilder local_118;
  FlatBufferBuilder local_98;
  
  if ((int)CONCAT71(in_register_00000039,run) != 0) {
    local_118.buf_.allocator_ = (Allocator *)operator_new(8);
    (local_118.buf_.allocator_)->_vptr_Allocator = (_func_int **)&PTR__Allocator_00201c00;
    local_118.buf_.own_allocator_ = true;
    local_118.buf_.initial_size_ = 0x800;
    local_118.buf_.max_size_ = 0x7fffffff;
    local_118.buf_.buffer_minalign_ = 8;
    local_118.buf_.reserved_ = 0;
    local_118.buf_.size_ = 0;
    local_118.length_of_64_bit_region_ = 0;
    local_118.nested = false;
    local_118.finished = false;
    local_118.buf_.scratch_._0_6_ = 0;
    local_118._78_8_ = 0;
    local_118.buf_.buf_ = (uint8_t *)0x0;
    local_118.buf_.cur_._0_6_ = 0;
    local_118.buf_.cur_._6_2_ = 0;
    local_118.minalign_ = 1;
    local_118.force_defaults_ = false;
    local_118.dedup_vtables_ = true;
    local_118.string_pool = (StringOffsetMap *)0x0;
    OVar3 = populate1(&local_118);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_118,OVar3.o,(char *)0x0,false);
    val = local_118.buf_.size_;
    local_98.buf_.allocator_ = (Allocator *)operator_new(8);
    (local_98.buf_.allocator_)->_vptr_Allocator = (_func_int **)&PTR__Allocator_00201c00;
    local_98.buf_.own_allocator_ = true;
    local_98.buf_.initial_size_ = 0x800;
    local_98.buf_.max_size_ = 0x7fffffff;
    local_98.buf_.buffer_minalign_ = 8;
    local_98.buf_.reserved_ = 0;
    local_98.buf_.size_ = 0;
    local_98.length_of_64_bit_region_ = 0;
    local_98.nested = false;
    local_98.finished = false;
    local_98.buf_.buf_ = (uint8_t *)0x0;
    local_98.buf_.cur_._0_6_ = 0;
    local_98.buf_.cur_._6_2_ = 0;
    local_98.buf_.scratch_._0_6_ = 0;
    local_98._78_8_ = 0;
    local_98.minalign_ = 1;
    local_98.force_defaults_ = false;
    local_98.dedup_vtables_ = true;
    local_98.string_pool = (StringOffsetMap *)0x0;
    OVar3 = populate2(&local_98);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_98,OVar3.o,(char *)0x0,false);
    val_00 = local_98.buf_.size_;
    flatbuffers::FlatBufferBuilderImpl<false>::Swap(&local_118,&local_98);
    TestEq<unsigned_int,unsigned_int>
              (local_118.buf_.size_,val_00,"\'src.GetSize()\' != \'size2\'",
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
               ,0xc5,
               "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
              );
    TestEq<unsigned_int,unsigned_int>
              (local_98.buf_.size_,val,"\'dst.GetSize()\' != \'size1\'",
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
               ,0xc6,
               "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
              );
    paVar1 = &local_138.field_2;
    local_138.field_2._M_allocated_capacity._0_4_ = 0x706d49;
    local_138._M_string_length = 3;
    local_138._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = release_n_verify(&local_118,&local_138,Color_Green);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
                      ,199,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    local_138.field_2._M_allocated_capacity = 0x6d65647265627943;
    local_138.field_2._8_2_ = 0x6e6f;
    local_138._M_string_length = 10;
    local_138.field_2._M_local_buf[10] = '\0';
    local_138._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = release_n_verify(&local_98,&local_138,Color_Red);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
                      ,200,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_98);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_118);
  }
  return;
}

Assistant:

static void builder_swap_after_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      src.Finish(root_offset1);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      dst.Finish(root_offset2);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      TEST_EQ_FUNC(src.GetSize(), size2);
      TEST_EQ_FUNC(dst.GetSize(), size1);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }